

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O0

EvaluatedDimension * __thiscall
slang::ast::ASTContext::evalPackedDimension(ASTContext *this,ElementSelectSyntax *syntax)

{
  bool bVar1;
  long in_RDX;
  ASTContext *in_RSI;
  EvaluatedDimension *in_RDI;
  SourceRange sourceRange;
  SyntaxNode *unaff_retaddr;
  EvaluatedDimension *in_stack_000000e8;
  bool in_stack_000000f7;
  SelectorSyntax *in_stack_000000f8;
  ASTContext *in_stack_00000100;
  EvaluatedDimension *in_stack_ffffffffffffffb0;
  EvaluatedDimension *this_00;
  DiagCode code;
  bitmask<slang::ast::ASTFlags> local_18;
  long local_10;
  
  this_00 = in_RDI;
  local_10 = in_RDX;
  EvaluatedDimension::EvaluatedDimension(in_stack_ffffffffffffffb0);
  if (*(long *)(local_10 + 0x28) == 0) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_18,DPIArg);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)this_00,
                       (bitmask<slang::ast::ASTFlags> *)in_RDI);
    if (bVar1) {
      in_RDI->kind = DPIOpenArray;
      return this_00;
    }
  }
  else {
    evalRangeDimension(in_stack_00000100,in_stack_000000f8,in_stack_000000f7,in_stack_000000e8);
  }
  if ((*(long *)(local_10 + 0x28) == 0) || (in_RDI->kind == Associative)) {
    code.subsystem = Declarations;
    code.code = 0x2d;
    sourceRange = slang::syntax::SyntaxNode::sourceRange(unaff_retaddr);
    addDiag(in_RSI,code,sourceRange);
  }
  return this_00;
}

Assistant:

EvaluatedDimension ASTContext::evalPackedDimension(const ElementSelectSyntax& syntax) const {
    EvaluatedDimension result;
    if (syntax.selector) {
        evalRangeDimension(*syntax.selector, /* isPacked */ true, result);
    }
    else if (flags.has(ASTFlags::DPIArg)) {
        result.kind = DimensionKind::DPIOpenArray;
        return result;
    }

    if (!syntax.selector || result.kind == DimensionKind::Associative)
        addDiag(diag::DimensionRequiresConstRange, syntax.sourceRange());

    return result;
}